

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaNodeInfoPtr *ppxVar1;
  xmlSchemaIDCAugPtr_conflict *ppxVar2;
  xmlSchemaPtr schema;
  xmlDocPtr pxVar3;
  xmlSchemaIDCPtr_conflict pxVar4;
  xmlSchemaAttributeUsePtr_conflict pxVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  xmlSchemaAttrInfoPtr pxVar13;
  ulong uVar14;
  xmlChar *pxVar15;
  xmlSchemaElementPtr pxVar16;
  xmlRegExecCtxtPtr exec;
  xmlSchemaTypePtr pxVar17;
  xmlSchemaNodeInfoPtr pxVar18;
  xmlSchemaTypePtr pxVar19;
  xmlSchemaIDCAugPtr_conflict pxVar20;
  xmlSchemaIDCMatcherPtr_conflict matcher;
  xmlSchemaAttributePtr_conflict pxVar21;
  xmlSchemaAttributePtr *ppxVar22;
  xmlSchemaValPtr pxVar23;
  xmlChar *pxVar24;
  xmlNsPtr pxVar25;
  xmlAttrPtr pxVar26;
  xmlSchemaNodeInfoPtr pxVar27;
  long lVar28;
  char *pcVar29;
  xmlSchemaIDCStateObjPtr_conflict sto;
  xmlSchemaIDCStateObjPtr_conflict pxVar30;
  xmlSchemaIDCMatcherPtr_conflict pxVar31;
  xmlSchemaIDCMatcherPtr *ppxVar32;
  ulong uVar33;
  xmlNodePtr pxVar34;
  xmlParserErrors xVar35;
  char *pcVar36;
  xmlNodePtr node;
  xmlSchemaAttributePtr pxVar37;
  xmlSchemaValidCtxtPtr pctxt;
  xmlSchemaValPtr *retVal;
  int *terminal_00;
  xmlSchemaIDCAugPtr_conflict pxVar38;
  xmlSchemaIDCPtr_conflict pxVar39;
  byte *name;
  byte *pbVar40;
  long *plVar41;
  ulong uVar42;
  ulong uVar43;
  bool bVar44;
  long lStackY_f0;
  xmlNodePtr in_stack_ffffffffffffff18;
  xmlSchemaPSVIIDCBindingPtr_conflict str2;
  xmlChar **in_stack_ffffffffffffff20;
  xmlChar *local_c0;
  int nbval;
  uint local_90;
  int terminal;
  xmlChar *values [10];
  
  iVar11 = (int)in_stack_ffffffffffffff18;
  if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) {
    pcVar29 = "in skip-state";
    goto LAB_0019ae25;
  }
  if (vctxt->xsiAssemble != 0) {
    pxVar13 = xmlSchemaGetMetaAttrInfo(vctxt,3);
    if (pxVar13 == (xmlSchemaAttrInfoPtr)0x0) {
      pxVar13 = xmlSchemaGetMetaAttrInfo(vctxt,4);
      iVar11 = (int)in_stack_ffffffffffffff18;
      if (pxVar13 != (xmlSchemaAttrInfoPtr)0x0) goto LAB_0019ae47;
    }
    else {
LAB_0019ae47:
      pbVar40 = pxVar13->value;
      local_c0 = (xmlChar *)0x0;
      iVar9 = 0;
      do {
        iVar11 = (int)in_stack_ffffffffffffff18;
        name = pbVar40;
        if (pxVar13->metaType == 3) {
          while ((uVar14 = (ulong)*name, uVar14 < 0x21 &&
                 ((0x100002600U >> (uVar14 & 0x3f) & 1) != 0))) {
            name = name + 1;
          }
          lVar28 = 0;
          while ((0x20 < (byte)uVar14 || ((0x100002601U >> (uVar14 & 0x3f) & 1) == 0))) {
            lVar8 = lVar28 + 1;
            lVar28 = lVar28 + 1;
            uVar14 = (ulong)name[lVar8];
          }
          if (lVar28 == 0) break;
          pbVar40 = name + lVar28;
          local_c0 = xmlDictLookup(vctxt->schema->dict,name,(int)lVar28);
        }
        while( true ) {
          iVar11 = (int)in_stack_ffffffffffffff18;
          uVar14 = (ulong)*pbVar40;
          if ((0x20 < uVar14) || ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0)) break;
          pbVar40 = pbVar40 + 1;
        }
        lVar28 = 0;
        while ((0x20 < (byte)uVar14 || ((0x100002601U >> (uVar14 & 0x3f) & 1) == 0))) {
          lVar8 = lVar28 + 1;
          lVar28 = lVar28 + 1;
          uVar14 = (ulong)pbVar40[lVar8];
        }
        if (lVar28 == 0) {
          if (pxVar13->metaType == 3) {
            iVar11 = 0;
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,pxVar13->node,
                       (xmlSchemaTypePtr)
                       "The value must consist of tuples: the target namespace name and the document\'s URI"
                       ,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)in_stack_ffffffffffffff20);
          }
          break;
        }
        pxVar15 = xmlDictLookup(vctxt->schema->dict,pbVar40,(int)lVar28);
        schema = vctxt->schema;
        pxVar34 = pxVar13->node;
        values[0] = (xmlChar *)0x0;
        if (schema == (xmlSchemaPtr)0x0) {
LAB_0019b2de:
          pcVar36 = "xmlSchemaAssembleByXSI";
          pcVar29 = "assembling schemata";
          goto LAB_0019b2ef;
        }
        pctxt = (xmlSchemaValidCtxtPtr)vctxt->pctxt;
        if (pctxt == (xmlSchemaValidCtxtPtr)0x0) {
          pcVar29 = "no parser context available";
          pctxt = vctxt;
LAB_0019b2d4:
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAssembleByLocation",pcVar29);
          goto LAB_0019b2de;
        }
        if (pctxt->doc == (xmlDocPtr)0x0) {
          pcVar29 = "no constructor";
          goto LAB_0019b2d4;
        }
        pxVar15 = xmlSchemaBuildAbsoluteURI((xmlDictPtr)pctxt->validationRoot,pxVar15,pxVar34);
        in_stack_ffffffffffffff20 = (xmlChar **)0x0;
        in_stack_ffffffffffffff18 = pxVar34;
        iVar9 = xmlSchemaAddSchemaDoc
                          ((xmlSchemaParserCtxtPtr)pctxt,1,pxVar15,(xmlDocPtr)0x0,(char *)0x0,0,
                           pxVar34,(xmlChar *)0x0,local_c0,(xmlSchemaBucketPtr_conflict *)values);
        if (iVar9 == 0) {
          if (values[0] == (xmlChar *)0x0) {
            in_stack_ffffffffffffff18 = (xmlNodePtr)0x0;
            xmlSchemaCustomWarning
                      ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_MISC,pxVar34,
                       (xmlSchemaTypePtr)"The document at location \'%s\' could not be acquired",
                       (char *)pxVar15,(xmlChar *)0x0,(xmlChar *)0x0,
                       (xmlChar *)in_stack_ffffffffffffff20);
          }
          else {
            if (pctxt->doc->last == (_xmlNode *)0x0) {
              pctxt->doc->last = (_xmlNode *)values[0];
            }
            pxVar3 = *(xmlDocPtr *)(values[0] + 0x20);
            if ((pxVar3 != (xmlDocPtr)0x0) && (*(int *)(values[0] + 0x34) == 0)) {
              pctxt->serror = (xmlStructuredErrorFunc)0x0;
              pctxt->user_data = pxVar3;
              iVar9 = xmlSchemaParseNewDocWithContext
                                ((xmlSchemaParserCtxtPtr)pctxt,schema,
                                 (xmlSchemaBucketPtr_conflict)values[0]);
              if (iVar9 == 0) {
                iVar11 = *(int *)((long)&pctxt->serror + 4);
                if (iVar11 == 0) {
LAB_0019b085:
                  xmlSchemaFixupComponents
                            ((xmlSchemaParserCtxtPtr)pctxt,(xmlSchemaBucketPtr_conflict)values[0]);
                  iVar9 = *(int *)&pctxt->serror;
                  if ((iVar9 != 0) && (vctxt->err == 0)) {
                    vctxt->err = iVar9;
                  }
                  iVar11 = *(int *)((long)&pctxt->serror + 4);
                }
                else {
                  iVar9 = *(int *)&pctxt->serror;
                }
              }
              else {
                if (iVar9 == -1) {
                  pctxt->user_data = (xmlDocPtr)0x0;
                  goto LAB_0019b2de;
                }
                iVar11 = *(int *)((long)&pctxt->serror + 4);
                if (iVar11 == 0) goto LAB_0019b085;
              }
              vctxt->nberrors = vctxt->nberrors + iVar11;
              pctxt->user_data = (xmlDocPtr)0x0;
              goto LAB_0019afaf;
            }
          }
          iVar9 = 0;
        }
        else {
LAB_0019afaf:
          if (iVar9 == -1) goto LAB_0019b2de;
        }
        iVar11 = (int)in_stack_ffffffffffffff18;
        pbVar40 = pbVar40 + lVar28;
      } while (*pbVar40 != 0);
      if (iVar9 == -1) {
        return -1;
      }
      if (iVar9 != 0) {
        vctxt->skipDepth = 0;
        return iVar9;
      }
    }
    xmlHashScan(vctxt->schema->schemasImports,xmlSchemaAugmentImportedIDC,vctxt);
  }
  if ((long)vctxt->depth < 1) {
    pxVar16 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
    pxVar18 = vctxt->inode;
    pxVar18->decl = pxVar16;
    if (pxVar16 == (xmlSchemaElementPtr)0x0) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)0x0,
                         "No matching global declaration available for the validation root",
                         (xmlChar *)0x0,(xmlChar *)0x0);
      iVar11 = 0x735;
      goto LAB_0019bab6;
    }
LAB_0019b480:
    ppxVar1 = &vctxt->inode;
    if (pxVar16->type == XML_SCHEMA_TYPE_ANY) {
      if (*(int *)&pxVar16->refNs == 1) {
        vctxt->skipDepth = vctxt->depth;
        return 0;
      }
      pxVar17 = (xmlSchemaTypePtr)xmlSchemaGetElem(vctxt->schema,pxVar18->localName,pxVar18->nsName)
      ;
      if (pxVar17 == (xmlSchemaTypePtr)0x0) {
        if (*(int *)&pxVar16->refNs == 3) {
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_1,(xmlNodePtr)0x0,
                             (xmlSchemaBasicItemPtr)0x0,
                             "No matching global element declaration available, but demanded by the strict wildcard"
                             ,(xmlChar *)0x0,(xmlChar *)0x0);
          iVar11 = vctxt->err;
          if (iVar11 != 0) {
            if (-1 < iVar11) goto LAB_0019bab6;
LAB_0019b70a:
            pcVar29 = "calling xmlSchemaValidateElemWildcard()";
            goto LAB_0019ae25;
          }
        }
        else {
          if ((vctxt->nbAttrInfos == 0) ||
             (pxVar13 = xmlSchemaGetMetaAttrInfo(vctxt,1), pxVar13 == (xmlSchemaAttrInfoPtr)0x0)) {
            pxVar17 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
            lStackY_f0 = 0x38;
            goto LAB_0019b4c5;
          }
          iVar11 = xmlSchemaProcessXSIType
                             (vctxt,pxVar13,&vctxt->inode->typeDef,(xmlSchemaElementPtr)0x0);
          if (iVar11 == -1) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElemWildcard",
                       "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'");
            goto LAB_0019b70a;
          }
        }
      }
      else {
        lStackY_f0 = 0x50;
LAB_0019b4c5:
        *(xmlSchemaTypePtr *)((long)&(*ppxVar1)->nodeType + lStackY_f0) = pxVar17;
      }
      pxVar18 = *ppxVar1;
      pxVar16 = pxVar18->decl;
      if (pxVar16->type != XML_SCHEMA_TYPE_ELEMENT) {
        pxVar18->decl = (xmlSchemaElementPtr)0x0;
        goto LAB_0019b9c2;
      }
    }
    if ((pxVar16->flags & 0x10) != 0) {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_2,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)0x0,"The element declaration is abstract",
                         (xmlChar *)0x0,(xmlChar *)0x0);
      iVar11 = vctxt->err;
      if (iVar11 == 0) {
        pxVar18 = *ppxVar1;
        goto LAB_0019b9c2;
      }
      if (-1 < iVar11) goto LAB_0019bab6;
      goto LAB_0019baf3;
    }
    pxVar17 = pxVar16->subtypes;
    if (pxVar17 != (xmlSchemaTypePtr)0x0) {
      if (vctxt->nbAttrInfos != 0) {
        pxVar18 = (xmlSchemaNodeInfoPtr)xmlSchemaGetMetaAttrInfo(vctxt,2);
        if (pxVar18 == (xmlSchemaNodeInfoPtr)0x0) {
LAB_0019b7ff:
          pxVar13 = xmlSchemaGetMetaAttrInfo(vctxt,1);
          if (pxVar13 != (xmlSchemaAttrInfoPtr)0x0) {
            values[0] = (xmlChar *)0x0;
            iVar11 = xmlSchemaProcessXSIType(vctxt,pxVar13,(xmlSchemaTypePtr *)values,pxVar16);
            if (iVar11 == -1) {
              xmlSchemaInternalErr
                        ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateElemDecl",
                         "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:type\'");
              goto LAB_0019baf3;
            }
            if (values[0] != (xmlChar *)0x0) {
              (*ppxVar1)->flags = (*ppxVar1)->flags | 8;
              pxVar17 = (xmlSchemaTypePtr)values[0];
            }
          }
          goto LAB_0019b84e;
        }
        vctxt->inode = pxVar18;
        pxVar19 = xmlSchemaGetBuiltInType(XML_SCHEMAS_BOOLEAN);
        iVar11 = xmlSchemaVCheckCVCSimpleType
                           ((xmlSchemaAbstractCtxtPtr)vctxt,(xmlNodePtr)0x0,pxVar19,pxVar18->value,
                            &pxVar18->val,1,0,0);
        vctxt->inode = vctxt->elemInfos[vctxt->depth];
        if (-1 < iVar11) {
          if (iVar11 == 0) {
            if ((pxVar16->flags & 1) == 0) {
              pcVar29 = "The element is not \'nillable\'";
              xVar35 = XML_SCHEMAV_CVC_ELT_3_1;
LAB_0019b5a5:
              xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,xVar35,(xmlNodePtr)0x0,
                                 (xmlSchemaBasicItemPtr)0x0,pcVar29,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            else {
              iVar11 = xmlSchemaValueGetAsBoolean(pxVar18->val);
              if (iVar11 != 0) {
                if (((pxVar16->flags & 8) != 0) && (pxVar16->value != (xmlChar *)0x0)) {
                  pcVar29 = 
                  "The element cannot be \'nilled\' because there is a fixed value constraint defined for it"
                  ;
                  xVar35 = XML_SCHEMAV_CVC_ELT_3_2_2;
                  goto LAB_0019b5a5;
                }
                (*ppxVar1)->flags = (*ppxVar1)->flags | 4;
              }
            }
          }
          goto LAB_0019b7ff;
        }
        pcVar36 = "xmlSchemaValidateElemDecl";
        pcVar29 = "calling xmlSchemaVCheckCVCSimpleType() to validate the attribute \'xsi:nil\'";
        goto LAB_0019bae9;
      }
LAB_0019b84e:
      pxVar39 = (xmlSchemaIDCPtr_conflict)pxVar16->idcs;
      pxVar18 = *ppxVar1;
      if (pxVar39 != (xmlSchemaIDCPtr_conflict)0x0) {
        if (pxVar18->idcMatchers != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
          pcVar29 = "The chain of IDC matchers is expected to be empty";
          goto LAB_0019bae6;
        }
        ppxVar2 = &vctxt->aidcs;
        pxVar31 = (xmlSchemaIDCMatcherPtr_conflict)0x0;
        do {
          pxVar38 = (xmlSchemaIDCAugPtr_conflict)ppxVar2;
          if ((pxVar39->type == XML_SCHEMA_TYPE_IDC_KEYREF) &&
             (pxVar4 = (xmlSchemaIDCPtr_conflict)pxVar39->ref->item,
             pxVar4 != (xmlSchemaIDCPtr_conflict)0x0)) {
            (*ppxVar1)->hasKeyrefs = 1;
            pxVar20 = (xmlSchemaIDCAugPtr_conflict)ppxVar2;
            do {
              pxVar20 = pxVar20->next;
              if (pxVar20 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_0019bad8;
            } while (pxVar20->def != pxVar4);
            if (vctxt->depth < pxVar20->keyrefDepth || pxVar20->keyrefDepth == -1) {
              pxVar20->keyrefDepth = vctxt->depth;
            }
          }
          do {
            pxVar38 = pxVar38->next;
            if (pxVar38 == (xmlSchemaIDCAugPtr_conflict)0x0) goto LAB_0019bad8;
          } while (pxVar38->def != pxVar39);
          matcher = vctxt->idcMatcherCache;
          if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
            matcher = (xmlSchemaIDCMatcherPtr_conflict)(*xmlMalloc)(0x48);
            if (matcher == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
              xmlSchemaVErrMemory(vctxt);
              goto LAB_0019baf3;
            }
            *(undefined8 *)&matcher->sizeKeySeqs = 0;
            matcher->targets = (xmlSchemaItemListPtr)0x0;
            *(undefined8 *)&matcher->idcType = 0;
            matcher->keySeqs = (xmlSchemaPSVIIDCKeyPtr **)0x0;
            matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
            matcher->aidc = (xmlSchemaIDCAugPtr_conflict)0x0;
            matcher->type = 0;
            matcher->depth = 0;
            matcher->next = (xmlSchemaIDCMatcherPtr)0x0;
            matcher->htab = (xmlHashTablePtr)0x0;
          }
          else {
            vctxt->idcMatcherCache = matcher->nextCached;
            matcher->nextCached = (xmlSchemaIDCMatcherPtr)0x0;
          }
          if (pxVar31 == (xmlSchemaIDCMatcherPtr_conflict)0x0) {
            ppxVar32 = &(*ppxVar1)->idcMatchers;
          }
          else {
            ppxVar32 = &pxVar31->next;
          }
          *ppxVar32 = matcher;
          matcher->type = 0;
          matcher->depth = vctxt->depth;
          matcher->aidc = pxVar38;
          matcher->idcType = pxVar38->def->type;
          iVar11 = xmlSchemaIDCAddStateObject(vctxt,matcher,pxVar39->selector,1);
          if (iVar11 == -1) goto LAB_0019baf3;
          pxVar39 = pxVar39->next;
          pxVar31 = matcher;
        } while (pxVar39 != (xmlSchemaIDCPtr)0x0);
        pxVar18 = *ppxVar1;
      }
      pxVar18->typeDef = pxVar17;
      goto LAB_0019b9c2;
    }
  }
  else {
    pxVar18 = vctxt->elemInfos[(long)vctxt->depth + -1];
    uVar10 = pxVar18->flags;
    if ((uVar10 & 0x20) != 0) {
      uVar10 = uVar10 & 0xffffffdf;
      pxVar18->flags = uVar10;
    }
    if ((uVar10 & 4) == 0) {
      pxVar17 = pxVar18->typeDef;
      if (pxVar17->builtInType == 0x2d) {
        pxVar16 = xmlSchemaGetElem(vctxt->schema,vctxt->inode->localName,vctxt->inode->nsName);
        pxVar18 = vctxt->inode;
        pxVar18->decl = pxVar16;
        if (pxVar16 == (xmlSchemaElementPtr)0x0) {
          pxVar13 = xmlSchemaGetMetaAttrInfo(vctxt,1);
          if (pxVar13 == (xmlSchemaAttrInfoPtr)0x0) {
            pxVar17 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
            vctxt->inode->typeDef = pxVar17;
          }
          else {
            iVar11 = xmlSchemaProcessXSIType
                               (vctxt,pxVar13,&pxVar18->typeDef,(xmlSchemaElementPtr)0x0);
            if (iVar11 != 0) {
              if (iVar11 == -1) {
                pcVar29 = "calling xmlSchemaProcessXSIType() to process the attribute \'xsi:nil\'";
                goto LAB_0019b68c;
              }
              goto LAB_0019b2a3;
            }
          }
        }
      }
      else {
        switch(pxVar17->contentType) {
        case XML_SCHEMA_CONTENT_EMPTY:
          vctxt->inode = pxVar18;
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_2_1,
                             (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                             "Element content is not allowed, because the content type is empty",
                             (xmlChar *)0x0,(xmlChar *)0x0);
          iVar11 = 0x731;
          goto LAB_0019b26d;
        case XML_SCHEMA_CONTENT_ELEMENTS:
        case XML_SCHEMA_CONTENT_MIXED:
          nbval = 10;
          if (pxVar17->contModel == (xmlRegexpPtr)0x0) {
            pcVar29 = "type has elem content but no content model";
          }
          else if ((uVar10 >> 8 & 1) == 0) {
            exec = pxVar18->regexCtxt;
            if (exec == (xmlRegExecCtxtPtr)0x0) {
              exec = xmlRegNewExecCtxt(pxVar17->contModel,xmlSchemaVContentModelCallback,vctxt);
              if (exec == (xmlRegExecCtxtPtr)0x0) {
                pcVar29 = "failed to create a regex context";
                goto LAB_0019b68c;
              }
              pxVar18->regexCtxt = exec;
            }
            pxVar27 = vctxt->inode;
            iVar9 = xmlRegExecPushString2(exec,pxVar27->localName,pxVar27->nsName,pxVar27);
            if (vctxt->err != 0x71a) {
              if (iVar9 < 0) {
                terminal_00 = &terminal;
                xmlRegExecErrInfo(exec,(xmlChar **)0x0,&nbval,(int *)&local_90,values,terminal_00);
                xmlSchemaComplexTypeErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,0x1d72b9,(xmlNodePtr)(ulong)(uint)nbval,
                           (xmlSchemaTypePtr)(ulong)local_90,(char *)values,(int)terminal_00,iVar11,
                           in_stack_ffffffffffffff20);
                iVar11 = vctxt->err;
                iVar9 = vctxt->depth;
                pxVar27 = vctxt->inode;
                goto LAB_0019b28b;
              }
              break;
            }
            pcVar29 = "calling xmlRegExecPushString2()";
          }
          else {
            pcVar29 = "validating elem, but elem content is already invalid";
          }
LAB_0019b68c:
          xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateChildElem",pcVar29)
          ;
          goto LAB_0019b699;
        case XML_SCHEMA_CONTENT_SIMPLE:
        case XML_SCHEMA_CONTENT_BASIC:
          vctxt->inode = pxVar18;
          if (pxVar17->type == XML_SCHEMA_TYPE_COMPLEX) {
            pcVar29 = 
            "Element content is not allowed, because the content type is a simple type definition";
            xVar35 = XML_SCHEMAV_CVC_COMPLEX_TYPE_2_2;
          }
          else {
            pcVar29 = "Element content is not allowed, because the type definition is simple";
            xVar35 = XML_SCHEMAV_CVC_TYPE_3_1_2;
          }
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,xVar35,(xmlNodePtr)0x0,
                             (xmlSchemaBasicItemPtr)0x0,pcVar29,(xmlChar *)0x0,(xmlChar *)0x0);
          iVar9 = vctxt->depth;
          pxVar27 = vctxt->elemInfos[iVar9];
          vctxt->inode = pxVar27;
          iVar11 = vctxt->err;
          goto LAB_0019b28b;
        }
      }
    }
    else {
      vctxt->inode = pxVar18;
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_ELT_3_2_1,(xmlNodePtr)0x0,
                         (xmlSchemaBasicItemPtr)0x0,
                         "Neither character nor element content is allowed, because the element was \'nilled\'"
                         ,(xmlChar *)0x0,(xmlChar *)0x0);
      iVar11 = 0x738;
LAB_0019b26d:
      iVar9 = vctxt->depth;
      pxVar27 = vctxt->elemInfos[iVar9];
      vctxt->inode = pxVar27;
LAB_0019b28b:
      vctxt->skipDepth = iVar9;
      pbVar40 = (byte *)((long)&pxVar27->flags + 1);
      *pbVar40 = *pbVar40 | 2;
      pbVar40 = (byte *)((long)&pxVar18->flags + 1);
      *pbVar40 = *pbVar40 | 1;
      if (iVar11 != 0) {
LAB_0019b2a3:
        if (-1 < iVar11) goto LAB_0019bab6;
LAB_0019b699:
        pcVar29 = "calling xmlSchemaStreamValidateChildElement()";
        goto LAB_0019ae25;
      }
    }
    if (vctxt->depth == vctxt->skipDepth) {
      return 0;
    }
    pxVar18 = vctxt->inode;
    pxVar16 = pxVar18->decl;
    if (pxVar16 != (xmlSchemaElementPtr)0x0) goto LAB_0019b480;
    if (pxVar18->typeDef == (xmlSchemaTypePtr)0x0) {
      pcVar29 = "the child element was valid but neither the declaration nor the type was set";
      goto LAB_0019ae25;
    }
LAB_0019b9c2:
    pxVar17 = pxVar18->typeDef;
    if (pxVar17 != (xmlSchemaTypePtr)0x0) {
      if ((pxVar17->flags & 0x100000) != 0) {
        pbVar40 = (byte *)((long)&pxVar18->flags + 1);
        *pbVar40 = *pbVar40 | 4;
        xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_2,(xmlNodePtr)0x0,
                           (xmlSchemaBasicItemPtr)0x0,"The type definition is abstract",
                           (xmlChar *)0x0,(xmlChar *)0x0);
        iVar11 = 0x754;
        goto LAB_0019bab6;
      }
      if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
        iVar11 = xmlSchemaXPathEvaluate(vctxt,XML_ELEMENT_NODE);
        pxVar18 = vctxt->inode;
        pxVar18->appliedXPath = 1;
        if (iVar11 == -1) {
          pcVar29 = "calling xmlSchemaXPathEvaluate()";
          goto LAB_0019ae25;
        }
        pxVar17 = pxVar18->typeDef;
      }
      if ((pxVar17->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar17->builtInType == 0x2d)) {
        uVar10 = vctxt->nbAttrInfos;
        plVar41 = (long *)pxVar17->attrUses;
        if (uVar10 == 0) {
          if (plVar41 != (long *)0x0) goto LAB_0019bb22;
        }
        else {
          if (plVar41 == (long *)0x0) {
            plVar41 = (long *)0x0;
            bVar44 = true;
            uVar12 = 0;
          }
          else {
LAB_0019bb22:
            uVar12 = *(uint *)(plVar41 + 1);
            bVar44 = false;
          }
          uVar33 = 0;
          uVar14 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar14 = uVar33;
          }
          uVar43 = (ulong)uVar12;
          if ((int)uVar12 < 1) {
            uVar43 = uVar33;
          }
          for (; uVar33 != uVar43; uVar33 = uVar33 + 1) {
            pxVar5 = *(xmlSchemaAttributeUsePtr_conflict *)(*plVar41 + uVar33 * 8);
            pxVar37 = pxVar5->attrDecl;
            for (uVar42 = 0; uVar14 != uVar42; uVar42 = uVar42 + 1) {
              pxVar13 = vctxt->attrInfos[uVar42];
              if (pxVar13->metaType == 0) {
                if (((*pxVar13->localName == *pxVar37->name) &&
                    (iVar11 = xmlStrEqual(pxVar13->localName,pxVar37->name), iVar11 != 0)) &&
                   (iVar11 = xmlStrEqual(pxVar13->nsName,pxVar37->targetNamespace), iVar11 != 0)) {
                  pxVar13->state = 2;
                  pxVar13->use = pxVar5;
                  pxVar13->decl = pxVar37;
                  pxVar13->typeDef = pxVar37->subtypes;
                  goto LAB_0019bc39;
                }
              }
            }
            if (pxVar5->occurs == 2) {
              if ((pxVar5->defValue != (xmlChar *)0x0) || (pxVar37->defValue != (xmlChar *)0x0)) {
                pxVar13 = xmlSchemaGetFreshAttrInfo(vctxt);
                if (pxVar13 == (xmlSchemaAttrInfoPtr)0x0) goto LAB_0019be4b;
                pxVar13->state = 8;
                pxVar13->use = pxVar5;
                pxVar13->decl = pxVar37;
                pxVar13->typeDef = pxVar37->subtypes;
                pxVar13->localName = pxVar37->name;
                pxVar13->nsName = pxVar37->targetNamespace;
              }
            }
            else if (pxVar5->occurs == 1) {
              pxVar13 = xmlSchemaGetFreshAttrInfo(vctxt);
              if (pxVar13 == (xmlSchemaAttrInfoPtr)0x0) {
LAB_0019be4b:
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                           "calling xmlSchemaGetFreshAttrInfo()");
                goto LAB_0019c455;
              }
              pxVar13->state = 4;
              pxVar13->use = pxVar5;
              pxVar13->decl = pxVar37;
            }
LAB_0019bc39:
          }
          iVar11 = vctxt->nbAttrInfos;
          if (iVar11 != 0) {
            if (pxVar17->attributeWildcard != (xmlSchemaWildcardPtr)0x0) {
              bVar7 = false;
              for (uVar33 = 0; iVar11 = 0xd, uVar33 != uVar14; uVar33 = uVar33 + 1) {
                pxVar13 = vctxt->attrInfos[uVar33];
                if ((pxVar13->state != 1) ||
                   (iVar9 = xmlSchemaCheckCVCWildcardNamespace
                                      (pxVar17->attributeWildcard,pxVar13->nsName), iVar9 != 0))
                goto LAB_0019bdb5;
                if (pxVar17->attributeWildcard->processContents == 1) {
LAB_0019bdb2:
                  pxVar13->state = iVar11;
                }
                else {
                  pxVar15 = pxVar13->localName;
                  pxVar21 = xmlSchemaGetAttributeDecl(vctxt->schema,pxVar15,pxVar13->nsName);
                  pxVar13->decl = pxVar21;
                  if (pxVar21 == (xmlSchemaAttributePtr_conflict)0x0) {
                    iVar11 = (uint)(pxVar17->attributeWildcard->processContents == 2) * 4 + 10;
                    goto LAB_0019bdb2;
                  }
                  pxVar13->state = 2;
                  pxVar19 = pxVar21->subtypes;
                  pxVar13->typeDef = pxVar19;
                  iVar11 = xmlSchemaIsDerivedFromBuiltInType(pxVar19,(int)pxVar15);
                  if (iVar11 != 0) {
                    iVar11 = 0xf;
                    bVar6 = !bVar7;
                    bVar7 = true;
                    if (bVar6) {
                      bVar7 = true;
                      if (bVar44) goto LAB_0019bdb5;
                      uVar10 = *(uint *)(plVar41 + 1);
                      if ((int)*(uint *)(plVar41 + 1) < 1) {
                        uVar10 = 0;
                      }
                      uVar43 = 0;
                      do {
                        if (uVar10 == uVar43) {
                          bVar7 = true;
                          goto LAB_0019bdb5;
                        }
                        iVar11 = xmlSchemaIsDerivedFromBuiltInType
                                           (*(xmlSchemaTypePtr *)
                                             (*(long *)(*(long *)(*plVar41 + uVar43 * 8) + 0x18) +
                                             0x60),(int)pxVar15);
                        uVar43 = uVar43 + 1;
                      } while (iVar11 == 0);
                      iVar11 = 0x10;
                      bVar7 = true;
                    }
                    goto LAB_0019bdb2;
                  }
                }
LAB_0019bdb5:
              }
              iVar11 = vctxt->nbAttrInfos;
              if (iVar11 == 0) goto LAB_0019c3bd;
            }
            if ((((vctxt->options & 1) == 0) ||
                (vctxt->elemInfos[vctxt->depth] == (xmlSchemaNodeInfoPtr)0x0)) ||
               (pxVar34 = vctxt->elemInfos[vctxt->depth]->node, pxVar34 == (xmlNodePtr)0x0)) {
              pxVar34 = (xmlNodePtr)0x0;
            }
            else if (pxVar34->doc == (_xmlDoc *)0x0) {
              pxVar34 = (xmlNodePtr)0x0;
            }
            lVar28 = 0;
LAB_0019bec0:
            if (lVar28 < iVar11) {
              pxVar18 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar28];
              iVar11 = pxVar18->depth;
              if ((iVar11 != 8) && (iVar11 != 2)) goto LAB_0019c1ec;
              if (pxVar18->typeDef == (xmlSchemaTypePtr)0x0) {
                pxVar18->depth = 6;
                goto LAB_0019c1ec;
              }
              vctxt->inode = pxVar18;
              if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
                iVar9 = 0;
LAB_0019bf38:
                if (iVar11 != 8) {
                  if (vctxt->value != (xmlSchemaValPtr)0x0) {
                    xmlSchemaFreeValue(vctxt->value);
                    vctxt->value = (xmlSchemaValPtr)0x0;
                  }
                  bVar44 = true;
                  if ((((*(xmlSchemaAttributePtr *)&pxVar18->normVal)->flags & 0x200) == 0) &&
                     ((pxVar18->decl == (xmlSchemaElementPtr)0x0 ||
                      (((ulong)pxVar18->decl->ref & 0x200) == 0)))) {
                    if (iVar9 != 0) {
                      bVar44 = false;
                      goto LAB_0019bfaf;
                    }
                    pxVar19 = pxVar18->typeDef;
                    node = pxVar18->node;
                    pxVar15 = pxVar18->value;
                    iVar11 = 0;
                    bVar44 = false;
                    retVal = (xmlSchemaValPtr *)0x0;
                  }
                  else {
LAB_0019bfaf:
                    *(byte *)&pxVar18->flags = (byte)pxVar18->flags | 0x10;
                    pxVar19 = pxVar18->typeDef;
                    node = pxVar18->node;
                    pxVar15 = pxVar18->value;
                    retVal = &pxVar18->val;
                    iVar11 = 1;
                  }
                  iVar11 = xmlSchemaVCheckCVCSimpleType
                                     ((xmlSchemaAbstractCtxtPtr)vctxt,node,pxVar19,pxVar15,retVal,1,
                                      iVar11,0);
                  if (iVar11 == 0) {
                    if ((bVar44) && (pxVar18->val != (xmlSchemaValPtr)0x0)) {
                      pxVar16 = pxVar18->decl;
                      if ((pxVar16 == (xmlSchemaElementPtr)0x0) ||
                         (pxVar16->subtypes == (xmlSchemaTypePtr)0x0)) {
                        pxVar37 = (xmlSchemaAttributePtr)
                                  (*(xmlSchemaAttributePtr *)&pxVar18->normVal)->defVal;
                        if (pxVar37 != (xmlSchemaAttributePtr)0x0) {
                          pxVar18->idcTable =
                               (xmlSchemaPSVIIDCBindingPtr_conflict)
                               (*(xmlSchemaAttributePtr *)&pxVar18->normVal)->defValue;
                          goto LAB_0019c1b7;
                        }
                      }
                      else {
                        pxVar37 = pxVar16->attributes;
                        if (pxVar37 != (xmlSchemaAttributePtr)0x0) {
                          pxVar18->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)pxVar16->subtypes
                          ;
LAB_0019c1b7:
                          iVar11 = xmlSchemaAreValuesEqual(pxVar18->val,(xmlSchemaValPtr)pxVar37);
                          if (iVar11 == 0) {
                            pxVar18->depth = 7;
                          }
                        }
                      }
                    }
                  }
                  else {
                    if (iVar11 == -1) {
                      pcVar29 = "calling xmlSchemaStreamValidateSimpleTypeValue()";
                      goto LAB_0019c42f;
                    }
                    pxVar18->depth = 5;
                  }
LAB_0019c1cd:
                  if (iVar9 == 0) {
LAB_0019c200:
                    pxVar30 = vctxt->xpathStates;
                    while ((pxVar30 != (xmlSchemaIDCStateObjPtr_conflict)0x0 &&
                           (iVar11 = xmlStreamPop((xmlStreamCtxtPtr)pxVar30->xpathCtxt),
                           iVar11 != -1))) {
                      pxVar30 = pxVar30->next;
                    }
                    goto LAB_0019c1ec;
                  }
                  iVar11 = xmlSchemaXPathProcessHistory(vctxt,vctxt->depth + 1);
                  if (iVar11 != -1) goto LAB_0019c1ec;
                  goto LAB_0019c3c4;
                }
                if (pxVar34 == (xmlNodePtr)0x0 && iVar9 == 0) goto LAB_0019c200;
                pxVar19 = pxVar18->decl->subtypes;
                if (pxVar19 == (xmlSchemaTypePtr)0x0) {
                  pxVar19 = (xmlSchemaTypePtr)
                            (*(xmlSchemaAttributePtr *)&pxVar18->normVal)->defValue;
                  ppxVar22 = (xmlSchemaAttributePtr *)
                             &(*(xmlSchemaAttributePtr *)&pxVar18->normVal)->defVal;
                }
                else {
                  ppxVar22 = &pxVar18->decl->attributes;
                }
                pxVar37 = *ppxVar22;
                pxVar18->value = (xmlChar *)pxVar19;
                pxVar18->val = (xmlSchemaValPtr)pxVar37;
                if (pxVar37 != (xmlSchemaAttributePtr)0x0) {
                  pxVar23 = xmlSchemaCopyValue((xmlSchemaValPtr)pxVar37);
                  pxVar18->val = pxVar23;
                  if (pxVar23 != (xmlSchemaValPtr)0x0) {
                    if (pxVar34 == (xmlNodePtr)0x0) goto LAB_0019c1cd;
                    pxVar15 = pxVar18->value;
                    pxVar24 = xmlSchemaNormalizeValue(pxVar18->typeDef,pxVar15);
                    if (pxVar24 != (xmlChar *)0x0) {
                      pxVar15 = pxVar24;
                    }
                    if (pxVar18->nsName != (xmlChar *)0x0) {
                      pxVar25 = xmlSearchNsByHref(pxVar34->doc,pxVar34,pxVar18->nsName);
                      if (pxVar25 == (xmlNsPtr)0x0) {
                        uVar14 = 0;
                        do {
                          snprintf((char *)values,0xd,"p%d",uVar14);
                          pxVar25 = xmlSearchNs(pxVar34->doc,pxVar34,(xmlChar *)values);
                          if ((int)uVar14 == 1000) {
                            xmlSchemaInternalErr
                                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex"
                                       ,
                                       "could not compute a ns prefix for a default/fixed attribute"
                                      );
                            if (pxVar24 != (xmlChar *)0x0) {
                              (*xmlFree)(pxVar24);
                            }
                            goto LAB_0019c43c;
                          }
                          uVar14 = (ulong)((int)uVar14 + 1);
                        } while (pxVar25 != (xmlNsPtr)0x0);
                        pxVar25 = xmlNewNs(vctxt->validationRoot,pxVar18->nsName,(xmlChar *)values);
                      }
                      xmlNewNsProp(pxVar34,pxVar25,pxVar18->localName,pxVar15);
LAB_0019c187:
                      if (pxVar24 != (xmlChar *)0x0) {
                        (*xmlFree)(pxVar24);
                      }
                      goto LAB_0019c1cd;
                    }
                    pxVar26 = xmlNewProp(pxVar34,pxVar18->localName,pxVar15);
                    if (pxVar26 != (xmlAttrPtr)0x0) goto LAB_0019c187;
                    xmlSchemaInternalErr
                              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                               "calling xmlNewProp()");
                    if (pxVar24 != (xmlChar *)0x0) {
                      (*xmlFree)(pxVar24);
                    }
                    goto LAB_0019c43c;
                  }
                  pcVar29 = "calling xmlSchemaCopyValue()";
                  goto LAB_0019c3d2;
                }
                pcVar29 = "default/fixed value on an attribute use was not precomputed";
LAB_0019c42f:
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar29);
              }
              else {
                iVar9 = xmlSchemaXPathEvaluate(vctxt,XML_ATTRIBUTE_NODE);
                if (iVar9 != -1) {
                  iVar11 = pxVar18->depth;
                  goto LAB_0019bf38;
                }
LAB_0019c3c4:
                pcVar29 = "calling xmlSchemaXPathEvaluate()";
LAB_0019c3d2:
                xmlSchemaInternalErr
                          ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar29);
              }
LAB_0019c43c:
              vctxt->inode = vctxt->elemInfos[vctxt->depth];
LAB_0019c455:
              bVar44 = true;
              goto LAB_0019c457;
            }
            for (lVar28 = 0; lVar28 < iVar11; lVar28 = lVar28 + 1) {
              pxVar18 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar28];
              uVar10 = pxVar18->depth;
              if ((uVar10 < 0x12) && ((0x26004U >> (uVar10 & 0x1f) & 1) != 0))
              goto switchD_0019c2a1_caseD_2;
              vctxt->inode = pxVar18;
              switch(uVar10) {
              case 1:
                if (*(int *)&pxVar18->field_0x5c == 0) {
                  if (pxVar17->attributeWildcard == (xmlSchemaWildcardPtr)0x0) {
                    xVar35 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1;
                  }
                  else {
                    xVar35 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2;
                  }
                  xmlSchemaIllegalAttrErr
                            ((xmlSchemaAbstractCtxtPtr)vctxt,xVar35,(xmlSchemaAttrInfoPtr)pxVar18,
                             (xmlNodePtr)&vctxt->inode);
                }
                break;
              case 4:
                values[0] = (xmlChar *)0x0;
                vctxt->inode = vctxt->elemInfos[vctxt->depth];
                pxVar15 = xmlSchemaFormatQName
                                    (values,(*(xmlSchemaAttributePtr *)&pxVar18->normVal)->
                                            targetNamespace,
                                     (*(xmlSchemaAttributePtr *)&pxVar18->normVal)->name);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_4,
                                   (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                                   "The attribute \'%s\' is required but missing",pxVar15,
                                   (xmlChar *)0x0);
                if (values[0] != (xmlChar *)0x0) {
                  (*xmlFree)(values[0]);
                }
                break;
              case 6:
                xVar35 = XML_SCHEMAV_CVC_ATTRIBUTE_2;
                pcVar29 = "The type definition is absent";
                goto LAB_0019c383;
              case 7:
                pxVar15 = pxVar18->value;
                str2 = pxVar18->idcTable;
                xVar35 = XML_SCHEMAV_CVC_AU;
                pcVar29 = "The value \'%s\' does not match the fixed value constraint \'%s\'";
                goto LAB_0019c386;
              case 10:
                xVar35 = XML_SCHEMAV_CVC_WILDCARD;
                pcVar29 = 
                "No matching global attribute declaration available, but demanded by the strict wildcard"
                ;
LAB_0019c383:
                str2 = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
                pxVar15 = (xmlChar *)0x0;
LAB_0019c386:
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,xVar35,(xmlNodePtr)0x0,
                                   (xmlSchemaBasicItemPtr)0x0,pcVar29,pxVar15,(xmlChar *)str2);
              }
switchD_0019c2a1_caseD_2:
              iVar11 = vctxt->nbAttrInfos;
            }
            vctxt->inode = vctxt->elemInfos[vctxt->depth];
          }
        }
LAB_0019c3bd:
        bVar44 = false;
      }
      else {
        iVar11 = vctxt->nbAttrInfos;
        iVar9 = 0;
        bVar44 = false;
        if (iVar11 != 0) {
          for (lVar28 = 0; lVar28 < iVar11; lVar28 = lVar28 + 1) {
            pxVar18 = (xmlSchemaNodeInfoPtr)(&((xmlNodePtr)vctxt->attrInfos)->_private)[lVar28];
            if (*(int *)&pxVar18->field_0x5c == 0) {
              vctxt->inode = pxVar18;
              iVar9 = 0x723;
              xmlSchemaIllegalAttrErr
                        ((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_3_1_1,
                         (xmlSchemaAttrInfoPtr)pxVar18,(xmlNodePtr)vctxt->attrInfos);
              iVar11 = vctxt->nbAttrInfos;
            }
          }
          vctxt->inode = vctxt->elemInfos[vctxt->depth];
          bVar44 = iVar9 == -1;
        }
      }
LAB_0019c457:
      if (vctxt->nbAttrInfos != 0) {
        xmlSchemaClearAttrInfos(vctxt);
      }
      if (!bVar44) {
        return 0;
      }
      pcVar29 = "calling attributes validation";
LAB_0019ae25:
      pcVar36 = "xmlSchemaValidateElem";
LAB_0019b2ef:
      xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,pcVar36,pcVar29);
      return -1;
    }
    pbVar40 = (byte *)((long)&pxVar18->flags + 1);
    *pbVar40 = *pbVar40 | 4;
  }
  xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_TYPE_1,(xmlNodePtr)0x0,
                     (xmlSchemaBasicItemPtr)0x0,"The type definition is absent",(xmlChar *)0x0,
                     (xmlChar *)0x0);
  iVar11 = 0x753;
LAB_0019bab6:
  vctxt->skipDepth = vctxt->depth;
  return iVar11;
LAB_0019bad8:
  pcVar29 = "Could not find an augmented IDC item for an IDC definition";
LAB_0019bae6:
  pcVar36 = "xmlSchemaIDCRegisterMatchers";
LAB_0019bae9:
  xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)vctxt,pcVar36,pcVar29);
LAB_0019baf3:
  pcVar29 = "calling xmlSchemaValidateElemDecl()";
  goto LAB_0019ae25;
LAB_0019c1ec:
  lVar28 = lVar28 + 1;
  iVar11 = vctxt->nbAttrInfos;
  goto LAB_0019bec0;
}

Assistant:

static int
xmlSchemaValidateElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if ((vctxt->skipDepth != -1) &&
	(vctxt->depth >= vctxt->skipDepth)) {
	VERROR_INT("xmlSchemaValidateElem",
	    "in skip-state");
	goto internal_error;
    }
    if (vctxt->xsiAssemble) {
	/*
	* We will stop validation if there was an error during
	* dynamic schema construction.
	* Note that we simply set @skipDepth to 0, this could
	* mean that a streaming document via SAX would be
	* still read to the end but it won't be validated any more.
	* TODO: If we are sure how to stop the validation at once
	*   for all input scenarios, then this should be changed to
	*   instantly stop the validation.
	*/
	ret = xmlSchemaAssembleByXSI(vctxt);
	if (ret != 0) {
	    if (ret == -1)
		goto internal_error;
	    vctxt->skipDepth = 0;
	    return(ret);
	}
        /*
         * Augment the IDC definitions for the main schema and all imported ones
         * NOTE: main schema is the first in the imported list
         */
        xmlHashScan(vctxt->schema->schemasImports, xmlSchemaAugmentImportedIDC,
                    vctxt);
    }
    if (vctxt->depth > 0) {
	/*
	* Validate this element against the content model
	* of the parent.
	*/
	ret = xmlSchemaValidateChildElem(vctxt);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaStreamValidateChildElement()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (vctxt->depth == vctxt->skipDepth)
	    goto exit;
	if ((vctxt->inode->decl == NULL) &&
	    (vctxt->inode->typeDef == NULL)) {
	    VERROR_INT("xmlSchemaValidateElem",
		"the child element was valid but neither the "
		"declaration nor the type was set");
	    goto internal_error;
	}
    } else {
	/*
	* Get the declaration of the validation root.
	*/
	vctxt->inode->decl = xmlSchemaGetElem(vctxt->schema,
	    vctxt->inode->localName,
	    vctxt->inode->nsName);
	if (vctxt->inode->decl == NULL) {
	    ret = XML_SCHEMAV_CVC_ELT_1;
	    VERROR(ret, NULL,
		"No matching global declaration available "
		"for the validation root");
	    goto exit;
	}
    }

    if (vctxt->inode->decl == NULL)
	goto type_validation;

    if (vctxt->inode->decl->type == XML_SCHEMA_TYPE_ANY) {
	int skip;
	/*
	* Wildcards.
	*/
	ret = xmlSchemaValidateElemWildcard(vctxt, &skip);
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidateElem",
		    "calling xmlSchemaValidateElemWildcard()");
		goto internal_error;
	    }
	    goto exit;
	}
	if (skip) {
	    vctxt->skipDepth = vctxt->depth;
	    goto exit;
	}
	/*
	* The declaration might be set by the wildcard validation,
	* when the processContents is "lax" or "strict".
	*/
	if (vctxt->inode->decl->type != XML_SCHEMA_TYPE_ELEMENT) {
	    /*
	    * Clear the "decl" field to not confuse further processing.
	    */
	    vctxt->inode->decl = NULL;
	    goto type_validation;
	}
    }
    /*
    * Validate against the declaration.
    */
    ret = xmlSchemaValidateElemDecl(vctxt);
    if (ret != 0) {
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaValidateElemDecl()");
	    goto internal_error;
	}
	goto exit;
    }
    /*
    * Validate against the type definition.
    */
type_validation:

    if (vctxt->inode->typeDef == NULL) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_1;
	VERROR(ret, NULL,
	    "The type definition is absent");
	goto exit;
    }
    if (vctxt->inode->typeDef->flags & XML_SCHEMAS_TYPE_ABSTRACT) {
	vctxt->inode->flags |= XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE;
	ret = XML_SCHEMAV_CVC_TYPE_2;
	    VERROR(ret, NULL,
	    "The type definition is abstract");
	goto exit;
    }
    /*
    * Evaluate IDCs. Do it here, since new IDC matchers are registered
    * during validation against the declaration. This must be done
    * _before_ attribute validation.
    */
    if (vctxt->xpathStates != NULL) {
	ret = xmlSchemaXPathEvaluate(vctxt, XML_ELEMENT_NODE);
	vctxt->inode->appliedXPath = 1;
	if (ret == -1) {
	    VERROR_INT("xmlSchemaValidateElem",
		"calling xmlSchemaXPathEvaluate()");
	    goto internal_error;
	}
    }
    /*
    * Validate attributes.
    */
    if (WXS_IS_COMPLEX(vctxt->inode->typeDef)) {
	if ((vctxt->nbAttrInfos != 0) ||
	    (vctxt->inode->typeDef->attrUses != NULL)) {

	    ret = xmlSchemaVAttributesComplex(vctxt);
	}
    } else if (vctxt->nbAttrInfos != 0) {

	ret = xmlSchemaVAttributesSimple(vctxt);
    }
    /*
    * Clear registered attributes.
    */
    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (ret == -1) {
	VERROR_INT("xmlSchemaValidateElem",
	    "calling attributes validation");
	goto internal_error;
    }
    /*
    * Don't return an error if attributes are invalid on purpose.
    */
    ret = 0;

exit:
    if (ret != 0)
	vctxt->skipDepth = vctxt->depth;
    return (ret);
internal_error:
    return (-1);
}